

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall testing::internal::UnitTestImpl::ConfigureStreamingOutput(UnitTestImpl *this)

{
  long lVar1;
  StreamingListener *this_00;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  string local_68;
  string local_48;
  
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,FLAGS_gtest_stream_result_to,
             DAT_001499d0 + FLAGS_gtest_stream_result_to);
  if (local_80 != 0) {
    lVar1 = std::__cxx11::string::find((char)&local_88,0x3a);
    if (lVar1 == -1) {
      printf("WARNING: unrecognized streaming target \"%s\" ignored.\n",local_88);
      fflush(_stdout);
    }
    else {
      this_00 = (StreamingListener *)operator_new(0x50);
      std::__cxx11::string::substr((ulong)&local_48,(ulong)&local_88);
      std::__cxx11::string::substr((ulong)&local_68,(ulong)&local_88);
      StreamingListener::StreamingListener(this_00,&local_48,&local_68);
      TestEventRepeater::Append((this->listeners_).repeater_,(TestEventListener *)this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  return;
}

Assistant:

void UnitTestImpl::ConfigureStreamingOutput() {
  const string& target = GTEST_FLAG(stream_result_to);
  if (!target.empty()) {
    const size_t pos = target.find(':');
    if (pos != string::npos) {
      listeners()->Append(new StreamingListener(target.substr(0, pos),
                                                target.substr(pos+1)));
    } else {
      printf("WARNING: unrecognized streaming target \"%s\" ignored.\n",
             target.c_str());
      fflush(stdout);
    }
  }
}